

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char> __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::buffer_appender<char>>
          (float_writer<char> *this,buffer_appender<char> it)

{
  bool bVar1;
  int iVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  buffer_appender<char> bVar4;
  __type _Var5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  char local_31 [3];
  char local_2e [4];
  char local_2a;
  char local_29;
  
  uVar8 = this->exp_ + this->num_digits_;
  if ((this->specs_).field_0x4 == '\x01') {
    local_29 = *this->digits_;
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&local_29);
    iVar9 = this->num_digits_;
    iVar11 = (this->specs_).precision - iVar9;
    if ((1 < iVar9) || (((this->specs_).field_0x6 & 0x10) != 0)) {
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 &this->decimal_point_);
      iVar9 = this->num_digits_;
    }
    bVar3.container =
         (buffer<char> *)
         std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                   (this->digits_ + 1,this->digits_ + iVar9,it);
    uVar12 = *(uint *)&(this->specs_).field_0x4;
    if ((uVar12 >> 0x14 & 1) != 0 && 0 < iVar11) {
      local_2a = '0';
      bVar3.container =
           (buffer<char> *)
           std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>
                     ((buffer_appender<char>)bVar3.container,iVar11,&local_2a);
      uVar12 = *(uint *)&(this->specs_).field_0x4;
    }
    local_2e[3] = ((uVar12 >> 0x10 & 1) == 0) << 5 | 0x45;
    buffer<char>::push_back(bVar3.container,local_2e + 3);
    bVar4 = write_exponent<char,fmt::v7::detail::buffer_appender<char>>
                      (uVar8 - 1,(buffer_appender<char>)bVar3.container);
    return (buffer_appender<char>)
           bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  if (this->exp_ < 0) {
    if ((int)uVar8 < 1) {
      local_31[1] = 0x30;
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 local_31 + 1);
      iVar9 = -uVar8;
      uVar12 = this->num_digits_;
      if (uVar12 == 0) {
        iVar11 = (this->specs_).precision;
        iVar2 = iVar9;
        if (SBORROW4(iVar11,iVar9) != (int)(iVar11 + uVar8) < 0) {
          iVar2 = iVar11;
        }
        if (-1 < iVar11) {
          iVar9 = iVar2;
        }
      }
      uVar8 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
      if (0 < (int)uVar12 && (char)(uVar8 >> 0x14) == '\0') {
        do {
          if (this->digits_[(ulong)uVar12 - 1] != '0') goto LAB_00114d3c;
          bVar1 = 1 < (int)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar1);
        uVar12 = 0;
      }
LAB_00114d3c:
      if ((uVar8 == 0 && iVar9 == 0) && uVar12 == 0) {
        return (buffer_appender<char>)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
      }
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 &this->decimal_point_);
      local_31[0] = '0';
      _Var5 = std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>(it,iVar9,local_31);
      bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                        (this->digits_,this->digits_ + (int)uVar12,
                         (buffer_appender<char>)
                         _Var5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
      ;
      return (buffer_appender<char>)
             bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar13 = (ulong)uVar8;
    bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_,this->digits_ + uVar13,it);
    if (((this->specs_).field_0x6 & 0x10) == 0) {
      uVar12 = this->num_digits_;
      lVar7 = (long)(int)uVar12;
      pcVar6 = this->digits_;
      uVar10 = uVar8;
      if ((int)uVar12 < (int)uVar8) {
        uVar10 = uVar12;
      }
      do {
        if (lVar7 <= (long)uVar13) {
LAB_00114de3:
          if (uVar10 != uVar8) {
            buffer<char>::push_back
                      ((buffer<char> *)
                       bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       &this->decimal_point_);
            pcVar6 = this->digits_;
          }
          bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                            (pcVar6 + uVar13,pcVar6 + (int)uVar10,bVar4);
          return (buffer_appender<char>)
                 bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
        }
        if (pcVar6[lVar7 + -1] != '0') {
          uVar10 = (uint)lVar7;
          goto LAB_00114de3;
        }
        lVar7 = lVar7 + -1;
      } while( true );
    }
    buffer<char>::push_back
              ((buffer<char> *)
               bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               &this->decimal_point_);
    bVar3.container =
         (buffer<char> *)
         std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                   (this->digits_ + uVar13,this->digits_ + this->num_digits_,bVar4);
    iVar9 = (this->specs_).precision;
    iVar11 = iVar9 - this->num_digits_;
    if (iVar11 == 0 || iVar9 < this->num_digits_) {
      return (buffer_appender<char>)bVar3.container;
    }
    pcVar6 = local_31 + 2;
  }
  else {
    bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_,this->digits_ + this->num_digits_,it);
    local_2e[2] = 0x30;
    bVar3.container =
         (buffer<char> *)
         std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>
                   (bVar4,uVar8 - this->num_digits_,local_2e + 2);
    if ((((this->specs_).field_0x6 & 0x10) == 0) && (-1 < (this->specs_).precision)) {
      return (buffer_appender<char>)bVar3.container;
    }
    buffer<char>::push_back(bVar3.container,&this->decimal_point_);
    iVar9 = (this->specs_).precision;
    iVar11 = iVar9 - uVar8;
    if (iVar11 == 0 || iVar9 < (int)uVar8) {
      if ((this->specs_).field_0x4 == '\x02') {
        return (buffer_appender<char>)bVar3.container;
      }
      local_2e[1] = 0x30;
      buffer<char>::push_back(bVar3.container,local_2e + 1);
      return (buffer_appender<char>)bVar3.container;
    }
    pcVar6 = local_2e;
  }
  *pcVar6 = '0';
  _Var5 = std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>
                    ((buffer_appender<char>)bVar3.container,iVar11,pcVar6);
  return (buffer_appender<char>)
         _Var5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }